

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>
               (PhysicalType arg_type,AggregateFunction *function)

{
  AggregateFunction *in_RSI;
  char in_DIL;
  
  if (in_DIL == -0x38) {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>
              (in_RSI);
  }
  else if (in_DIL == '\a') {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>
              (in_RSI);
  }
  else if (in_DIL == '\t') {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>
              (in_RSI);
  }
  else if (in_DIL == '\v') {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>
              (in_RSI);
  }
  else if (in_DIL == '\f') {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>
              (in_RSI);
  }
  else {
    SpecializeArgMinMaxNFunction<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>
              (in_RSI);
  }
  return;
}

Assistant:

static void SpecializeArgMinMaxNFunction(PhysicalType arg_type, AggregateFunction &function) {
	switch (arg_type) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::VARCHAR:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxStringValue, COMPARATOR>(function);
		break;
	case PhysicalType::INT32:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxFixedValue<int32_t>, COMPARATOR>(function);
		break;
	case PhysicalType::INT64:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxFixedValue<int64_t>, COMPARATOR>(function);
		break;
	case PhysicalType::FLOAT:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxFixedValue<float>, COMPARATOR>(function);
		break;
	case PhysicalType::DOUBLE:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxFixedValue<double>, COMPARATOR>(function);
		break;
#endif
	default:
		SpecializeArgMinMaxNFunction<VAL_TYPE, MinMaxFallbackValue, COMPARATOR>(function);
		break;
	}
}